

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

void __thiscall
despot::POMDPXState::POMDPXState(POMDPXState *this,vector<int,_std::allocator<int>_> *aIndex)

{
  vector<int,_std::allocator<int>_> *aIndex_local;
  POMDPXState *this_local;
  
  State::State(&this->super_State);
  (this->super_State)._vptr_State = (_func_int **)&PTR__POMDPXState_0026ea78;
  std::vector<int,_std::allocator<int>_>::vector(&this->vec_id);
  std::vector<int,_std::allocator<int>_>::operator=(&this->vec_id,aIndex);
  return;
}

Assistant:

POMDPXState::POMDPXState(vector<int> aIndex) {
	vec_id = aIndex;
}